

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testopal.cpp
# Opt level: O0

void change_setting_proc(Am_Object *self)

{
  bool bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object *pAVar6;
  ostream *poVar7;
  Am_Wrapper *pAVar8;
  void *pvVar9;
  Am_Style *local_2c0;
  char *local_2b0;
  Am_Object local_178;
  Am_Object local_170;
  Am_Object o2;
  Am_Input_Char local_160;
  int local_15c;
  Am_Input_Char local_158;
  int width;
  Am_Input_Char local_150;
  int left;
  int local_148;
  int y1;
  int x1_1;
  Am_Object in_obj;
  int y;
  int x;
  Am_Input_Char local_124;
  int x1;
  Am_Input_Char local_11c;
  Am_Input_Char local_118;
  Am_Input_Char local_114;
  Am_Input_Char local_110;
  Am_Input_Char local_10c;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Input_Char local_ec;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Input_Char local_d4;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Input_Char local_bc;
  Am_Object local_b8;
  Am_Input_Char local_ac;
  Am_Object local_a8;
  Am_Object local_a0;
  int local_94;
  int depth;
  Am_Input_Char local_84;
  Am_Input_Char local_80;
  Am_Input_Char local_7c;
  Am_Input_Char local_78;
  Am_Input_Char local_74;
  Am_Input_Char local_70;
  Am_Input_Char local_6c;
  Am_Object local_68;
  Am_Input_Char local_60;
  Am_Input_Char local_5c;
  Am_Object local_58;
  Am_Object local_50;
  Am_Input_Char local_48;
  Am_Input_Char local_44;
  Am_Object local_40;
  Am_Input_Char local_38;
  Am_Input_Char local_34;
  Am_Input_Char local_30 [5];
  Am_Input_Char local_1c;
  Am_Input_Char c;
  Am_Object inter;
  Am_Object *self_local;
  
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffe8,(Am_Slot_Flags)self);
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)(Am_Object *)&stack0xffffffffffffffe8,0x11b);
  Am_Input_Char::Am_Input_Char(&local_1c,pAVar5);
  Am_Input_Char::Am_Input_Char(local_30,"q",true);
  bVar1 = Am_Input_Char::operator==(&local_1c,local_30[0]);
  if (bVar1) {
    pAVar8 = Am_Object::operator_cast_to_Am_Wrapper_(&screen2);
    if (pAVar8 != (Am_Wrapper *)0x0) {
      Am_Object::Destroy();
    }
    Am_Exit_Main_Event_Loop();
  }
  else {
    Am_Input_Char::Am_Input_Char(&local_34,"?",true);
    bVar1 = Am_Input_Char::operator==(&local_1c,local_34);
    if (bVar1) {
      print_help();
    }
    else {
      Am_Input_Char::Am_Input_Char(&local_38,"0",true);
      bVar1 = Am_Input_Char::operator==(&local_1c,local_38);
      if (bVar1) {
        if ((change_setting_proc::mode0 & 1U) == 0) {
          change_setting_proc::mode0 = true;
          uVar3 = Am_Object::Set(0xd328,100,100);
          Am_Object::Set(uVar3,0x65,100);
          Am_Object::Remove_From_Owner();
          uVar3 = Am_Object::Set(0xd328,100,0x5a);
          Am_Object::Set(uVar3,0x65,0x5a);
        }
        else {
          change_setting_proc::mode0 = false;
          uVar3 = Am_Object::Set(0xd328,100,0x5a);
          Am_Object::Set(uVar3,0x65,0x5a);
          Am_Object::Am_Object(&local_40,&g1);
          Am_Object::Add_Part((Am_Object)0x10d2d8,SUB81(&local_40,0),1);
          Am_Object::~Am_Object(&local_40);
          uVar3 = Am_Object::Set(0xd328,100,0x8c);
          Am_Object::Set(uVar3,0x65,0x96);
        }
      }
      else {
        Am_Input_Char::Am_Input_Char(&local_44,"1",true);
        bVar1 = Am_Input_Char::operator==(&local_1c,local_44);
        if (bVar1) {
          if ((change_setting_proc::mode1 & 1U) == 0) {
            change_setting_proc::mode1 = true;
            Am_Object::Set(0xd2d8,(char *)0x6c,0x10a62e);
          }
          else {
            change_setting_proc::mode1 = false;
            Am_Object::Set(0xd2d8,(char *)0x6c,0x10a3e6);
          }
        }
        else {
          Am_Input_Char::Am_Input_Char(&local_48,"2",true);
          bVar1 = Am_Input_Char::operator==(&local_1c,local_48);
          if (bVar1) {
            if ((change_setting_proc::mode2 & 1U) == 0) {
              change_setting_proc::mode2 = true;
              Am_Object::Destroy();
            }
            else {
              change_setting_proc::mode2 = false;
              Am_Object::Create((char *)&local_58);
              pAVar8 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
              uVar3 = Am_Object::Set((ushort)&local_58,(Am_Wrapper *)0x6a,(ulong)pAVar8);
              uVar3 = Am_Object::Set(uVar3,100,5);
              uVar3 = Am_Object::Set(uVar3,0x65,5);
              uVar3 = Am_Object::Set(uVar3,0x66,0x32);
              pAVar6 = (Am_Object *)Am_Object::Set(uVar3,0x67,0x1e);
              pAVar6 = (Am_Object *)Am_Object::operator=(&eek,pAVar6);
              Am_Object::Am_Object(&local_50,pAVar6);
              Am_Object::Add_Part((Am_Object)0x10d328,SUB81(&local_50,0),1);
              Am_Object::~Am_Object(&local_50);
              Am_Object::~Am_Object(&local_58);
            }
          }
          else {
            Am_Input_Char::Am_Input_Char(&local_5c,"3",true);
            bVar1 = Am_Input_Char::operator==(&local_1c,local_5c);
            if (bVar1) {
              if ((change_setting_proc::mode3 & 1U) == 0) {
                change_setting_proc::mode3 = true;
                uVar3 = Am_Object::Set(0xd318,100,100);
                Am_Object::Set(uVar3,0x65,100);
                Am_Object::Set(0xd318,true,0);
              }
              else {
                change_setting_proc::mode3 = false;
                Am_Object::Set(0xd318,true,1);
                uVar3 = Am_Object::Set(0xd318,100,0x14);
                Am_Object::Set(uVar3,0x65,0x14);
              }
            }
            else {
              Am_Input_Char::Am_Input_Char(&local_60,"4",true);
              bVar1 = Am_Input_Char::operator==(&local_1c,local_60);
              if (bVar1) {
                if ((change_setting_proc::mode4 & 1U) == 0) {
                  change_setting_proc::mode4 = true;
                  Am_Object::Remove_From_Owner();
                }
                else {
                  change_setting_proc::mode4 = false;
                  Am_Object::Am_Object(&local_68,&g1);
                  Am_Object::Add_Part((Am_Object)0x10d2d8,SUB81(&local_68,0),1);
                  Am_Object::~Am_Object(&local_68);
                }
              }
              else {
                Am_Input_Char::Am_Input_Char(&local_6c,"5",true);
                bVar1 = Am_Input_Char::operator==(&local_1c,local_6c);
                if (bVar1) {
                  bVar2 = Am_Object::Valid();
                  if ((bVar2 & 1) == 0) {
                    poVar7 = std::operator<<((ostream *)&std::cout,
                                             "** Can\'t do test 5 now because rectangle is gone; Use 2 to bring it back\n"
                                            );
                    std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
                  }
                  else if ((change_setting_proc::mode5 & 1U) == 0) {
                    change_setting_proc::mode5 = true;
                    uVar3 = Am_Object::Set(0xd330,100,10);
                    Am_Object::Set(uVar3,0x65,10);
                  }
                  else {
                    change_setting_proc::mode5 = false;
                    uVar3 = Am_Object::Set(0xd330,100,5);
                    Am_Object::Set(uVar3,0x65,5);
                  }
                }
                else {
                  Am_Input_Char::Am_Input_Char(&local_70,"6",true);
                  bVar1 = Am_Input_Char::operator==(&local_1c,local_70);
                  if (bVar1) {
                    if ((change_setting_proc::mode6 & 1U) == 0) {
                      change_setting_proc::mode6 = true;
                      Am_Object::Set(0xd2f8,0x65,0x82);
                    }
                    else {
                      change_setting_proc::mode6 = false;
                      Am_Object::Set(0xd2f8,0x65,0x96);
                    }
                  }
                  else {
                    Am_Input_Char::Am_Input_Char(&local_74,"7",true);
                    bVar1 = Am_Input_Char::operator==(&local_1c,local_74);
                    if (bVar1) {
                      if ((change_setting_proc::mode7 & 1U) == 0) {
                        change_setting_proc::mode7 = true;
                        Am_Object::Set(0xd2f8,true,0);
                      }
                      else {
                        change_setting_proc::mode7 = false;
                        Am_Object::Set(0xd2f8,true,1);
                      }
                    }
                    else {
                      Am_Input_Char::Am_Input_Char(&local_78,"8",true);
                      bVar1 = Am_Input_Char::operator==(&local_1c,local_78);
                      if (bVar1) {
                        if ((change_setting_proc::mode8 & 1U) == 0) {
                          change_setting_proc::mode8 = true;
                          Am_Object::Set(0xd2f8,0x66,100);
                        }
                        else {
                          change_setting_proc::mode8 = false;
                          Am_Object::Set(0xd2f8,0x66,0x50);
                        }
                      }
                      else {
                        Am_Input_Char::Am_Input_Char(&local_7c,"9",true);
                        bVar1 = Am_Input_Char::operator==(&local_1c,local_7c);
                        if (bVar1) {
                          if ((change_setting_proc::mode9 & 1U) == 0) {
                            change_setting_proc::mode9 = true;
                            Am_Object::Set(0xd2d8,0x66,0xfa);
                          }
                          else {
                            change_setting_proc::mode9 = false;
                            Am_Object::Set(0xd2d8,0x66,200);
                          }
                        }
                        else {
                          Am_Input_Char::Am_Input_Char(&local_80,"a",true);
                          bVar1 = Am_Input_Char::operator==(&local_1c,local_80);
                          if (bVar1) {
                            if ((change_setting_proc::modea & 1U) == 0) {
                              change_setting_proc::modea = true;
                              pAVar8 = Am_Style::operator_cast_to_Am_Wrapper_
                                                 ((Am_Style *)&Am_Yellow);
                              Am_Object::Set(0xd320,(Am_Wrapper *)0x6a,(ulong)pAVar8);
                            }
                            else {
                              change_setting_proc::modea = false;
                              pAVar8 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White)
                              ;
                              Am_Object::Set(0xd320,(Am_Wrapper *)0x6a,(ulong)pAVar8);
                            }
                          }
                          else {
                            Am_Input_Char::Am_Input_Char(&local_84,"b",true);
                            bVar1 = Am_Input_Char::operator==(&local_1c,local_84);
                            if (bVar1) {
                              if ((change_setting_proc::modeb & 1U) == 0) {
                                change_setting_proc::modeb = true;
                                Am_Object::Create(&stack0xffffffffffffff70);
                                pAVar6 = (Am_Object *)
                                         Am_Object::Set((ushort)&stack0xffffffffffffff70,100,0x177);
                                Am_Object::operator=(&second,pAVar6);
                                Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff70);
                                Am_Object::Get_Object((ushort)&local_a0,0x10d2e8);
                                pAVar5 = (Am_Value *)Am_Object::Get((ushort)&local_a0,0x86);
                                iVar4 = Am_Value::operator_cast_to_int(pAVar5);
                                Am_Object::~Am_Object(&local_a0);
                                local_94 = iVar4;
                                poVar7 = std::operator<<((ostream *)&std::cout,"Depth of r1 = ");
                                poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_94);
                                poVar7 = std::operator<<(poVar7," [-1]");
                                std::ostream::operator<<
                                          (poVar7,std::endl<char,std::char_traits<char>>);
                                Am_Object::Am_Object(&local_a8,&second);
                                Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_a8,0),
                                                    1);
                                Am_Object::~Am_Object(&local_a8);
                              }
                              else {
                                change_setting_proc::modeb = false;
                                Am_Object::Destroy();
                              }
                            }
                            else {
                              Am_Input_Char::Am_Input_Char(&local_ac,"c",true);
                              bVar1 = Am_Input_Char::operator==(&local_1c,local_ac);
                              if (bVar1) {
                                if ((change_setting_proc::modec & 1U) == 0) {
                                  change_setting_proc::modec = true;
                                  Am_Object::Remove_From_Owner();
                                }
                                else {
                                  change_setting_proc::modec = false;
                                  Am_Object::Am_Object(&local_b8,&window);
                                  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,
                                                      SUB81(&local_b8,0),1);
                                  Am_Object::~Am_Object(&local_b8);
                                }
                              }
                              else {
                                Am_Input_Char::Am_Input_Char(&local_bc,"d",true);
                                bVar1 = Am_Input_Char::operator==(&local_1c,local_bc);
                                if (bVar1) {
                                  if ((change_setting_proc::moded & 1U) == 0) {
                                    change_setting_proc::moded = true;
                                    Am_Object::Copy((char *)&local_c8);
                                    pAVar6 = (Am_Object *)
                                             Am_Object::Set((ushort)&local_c8,0x65,0x1c7);
                                    Am_Object::operator=(&third,pAVar6);
                                    Am_Object::~Am_Object(&local_c8);
                                    Am_Object::Am_Object(&local_d0,&third);
                                    Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,
                                                        SUB81(&local_d0,0),1);
                                    Am_Object::~Am_Object(&local_d0);
                                  }
                                  else {
                                    change_setting_proc::moded = false;
                                    Am_Object::Destroy();
                                  }
                                }
                                else {
                                  Am_Input_Char::Am_Input_Char(&local_d4,"e",true);
                                  bVar1 = Am_Input_Char::operator==(&local_1c,local_d4);
                                  if (bVar1) {
                                    if ((change_setting_proc::modee & 1U) == 0) {
                                      change_setting_proc::modee = true;
                                      Am_Object::Get_Object((ushort)&local_e8,0x10d328);
                                      Am_To_Top((Am_Object_Data *)&local_e8);
                                      Am_Object::~Am_Object(&local_e8);
                                    }
                                    else {
                                      change_setting_proc::modee = false;
                                      Am_Object::Get_Object((ushort)&local_e0,0x10d328);
                                      Am_To_Bottom((Am_Object_Data *)&local_e0);
                                      Am_Object::~Am_Object(&local_e0);
                                    }
                                  }
                                  else {
                                    Am_Input_Char::Am_Input_Char(&local_ec,"f",true);
                                    bVar1 = Am_Input_Char::operator==(&local_1c,local_ec);
                                    if (bVar1) {
                                      if ((change_setting_proc::modef & 1U) == 0) {
                                        change_setting_proc::modef = true;
                                        Am_Object::Am_Object(&local_100,&r1);
                                        Am_Object::Am_Object(&local_108,&r2);
                                        Am_Move_Object((Am_Object_Data *)&local_100,
                                                       (Am_Object_Data *)&local_108,true);
                                        Am_Object::~Am_Object(&local_108);
                                        Am_Object::~Am_Object(&local_100);
                                      }
                                      else {
                                        change_setting_proc::modef = false;
                                        Am_Object::Am_Object(&local_f8,&r1);
                                        Am_To_Bottom((Am_Object_Data *)&local_f8);
                                        Am_Object::~Am_Object(&local_f8);
                                      }
                                    }
                                    else {
                                      Am_Input_Char::Am_Input_Char(&local_10c,"g",true);
                                      bVar1 = Am_Input_Char::operator==(&local_1c,local_10c);
                                      if (bVar1) {
                                        change_setting_proc::mode =
                                             (bool)((change_setting_proc::mode ^ 0xffU) & 1);
                                        if (change_setting_proc::mode == false) {
                                          local_2b0 = "Foo and Bar";
                                        }
                                        else {
                                          local_2b0 = "Hello World";
                                        }
                                        Am_Object::Set(0xd2d8,(char *)0x6d,(ulong)local_2b0);
                                      }
                                      else {
                                        Am_Input_Char::Am_Input_Char(&local_110,"h",true);
                                        bVar1 = Am_Input_Char::operator==(&local_1c,local_110);
                                        if (bVar1) {
                                          change_setting_proc(Am_Object)::mode =
                                               (bool)(~change_setting_proc(Am_Object)::mode & 1);
                                          Am_Object::Set(0xd2d8,true,
                                                         (ulong)change_setting_proc(Am_Object)::mode
                                                        );
                                        }
                                        else {
                                          Am_Input_Char::Am_Input_Char(&local_114,"i",true);
                                          bVar1 = Am_Input_Char::operator==(&local_1c,local_114);
                                          if (bVar1) {
                                            change_setting_proc(Am_Object)::mode =
                                                 (bool)(~change_setting_proc(Am_Object)::mode & 1);
                                            Am_Object::Set(0xd2d8,true,
                                                           (ulong)change_setting_proc(Am_Object)::
                                                                  mode);
                                          }
                                          else {
                                            Am_Input_Char::Am_Input_Char(&local_118,"j",true);
                                            bVar1 = Am_Input_Char::operator==(&local_1c,local_118);
                                            if (bVar1) {
                                              if ((change_setting_proc(Am_Object)::mode & 1U) == 0)
                                              {
                                                local_2c0 = (Am_Style *)&Am_Blue;
                                              }
                                              else {
                                                local_2c0 = (Am_Style *)&Am_Orange;
                                              }
                                              pAVar8 = Am_Style::operator_cast_to_Am_Wrapper_
                                                                 (local_2c0);
                                              Am_Object::Set(0xd2d8,(Am_Wrapper *)0x6a,(ulong)pAVar8
                                                            );
                                              change_setting_proc(Am_Object)::mode =
                                                   (bool)((change_setting_proc(Am_Object)::mode ^
                                                          0xffU) & 1);
                                            }
                                            else {
                                              Am_Input_Char::Am_Input_Char(&local_11c,"k",true);
                                              bVar1 = Am_Input_Char::operator==(&local_1c,local_11c)
                                              ;
                                              if (bVar1) {
                                                switch(change_setting_proc(Am_Object)::mode) {
                                                case 0:
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                           "use min = false");
                                                  std::ostream::operator<<
                                                            (poVar7,std::
                                                  endl<char,std::char_traits<char>>);
                                                  Am_Object::Set(0xd2d8,0x70,0x32);
                                                  break;
                                                case 1:
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                           "min width = 50");
                                                  std::ostream::operator<<
                                                            (poVar7,std::
                                                  endl<char,std::char_traits<char>>);
                                                  Am_Object::Set(0xd2d8,true,1);
                                                  break;
                                                case 2:
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                           "min width = 70");
                                                  std::ostream::operator<<
                                                            (poVar7,std::
                                                  endl<char,std::char_traits<char>>);
                                                  Am_Object::Set(0xd2d8,0x70,0x46);
                                                  break;
                                                case 3:
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                           "min width = false");
                                                  std::ostream::operator<<
                                                            (poVar7,std::
                                                  endl<char,std::char_traits<char>>);
                                                  Am_Object::Set(0xd2d8,true,0);
                                                }
                                                change_setting_proc(Am_Object)::mode =
                                                     (change_setting_proc(Am_Object)::mode + 1) % 4;
                                              }
                                              else {
                                                Am_Input_Char::Am_Input_Char
                                                          ((Am_Input_Char *)&x1,"l",true);
                                                bVar1 = Am_Input_Char::operator==
                                                                  (&local_1c,(Am_Input_Char)x1);
                                                if (bVar1) {
                                                  switch(change_setting_proc(Am_Object)::mode) {
                                                  case 0:
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "max width = false max height = 250");
                                                  std::ostream::operator<<
                                                            (poVar7,std::
                                                  endl<char,std::char_traits<char>>);
                                                  Am_Object::Set(0xd2d8,0x6e,200);
                                                  Am_Object::Set(0xd2d8,0x6f,0xfa);
                                                  Am_Object::Set(0xd2d8,true,1);
                                                  break;
                                                  case 1:
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "max width = 200 max height = 250");
                                                  std::ostream::operator<<
                                                            (poVar7,std::
                                                  endl<char,std::char_traits<char>>);
                                                  Am_Object::Set(0xd2d8,true,1);
                                                  break;
                                                  case 2:
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "max width = 150 max height = false");
                                                  std::ostream::operator<<
                                                            (poVar7,std::
                                                  endl<char,std::char_traits<char>>);
                                                  Am_Object::Set(0xd2d8,0x6e,0x96);
                                                  Am_Object::Set(0xd2d8,true,0);
                                                  break;
                                                  case 3:
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "max width = false max height = false");
                                                  std::ostream::operator<<
                                                            (poVar7,std::
                                                  endl<char,std::char_traits<char>>);
                                                  Am_Object::Set(0xd2d8,true,0);
                                                  }
                                                  change_setting_proc(Am_Object)::mode =
                                                       (change_setting_proc(Am_Object)::mode + 1) %
                                                       4;
                                                }
                                                else {
                                                  Am_Input_Char::Am_Input_Char(&local_124,"X",true);
                                                  bVar1 = Am_Input_Char::operator==
                                                                    (&local_1c,local_124);
                                                  if (bVar1) {
                                                    pAVar5 = (Am_Value *)Am_Object::Get(0xd310,0x8b)
                                                    ;
                                                    x = Am_Value::operator_cast_to_int(pAVar5);
                                                    Am_Object::Set(0xd310,0x8b,(ulong)(x + 5));
                                                  }
                                                  else {
                                                    Am_Input_Char::Am_Input_Char
                                                              ((Am_Input_Char *)&y,"p",true);
                                                    bVar1 = Am_Input_Char::operator==
                                                                      (&local_1c,(Am_Input_Char)y);
                                                    if (bVar1) {
                                                      pAVar5 = (Am_Value *)
                                                               Am_Object::Get((ushort)&
                                                  stack0xffffffffffffffe8,0x11f);
                                                  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
                                                  pAVar5 = (Am_Value *)
                                                           Am_Object::Get((ushort)&
                                                  stack0xffffffffffffffe8,0x120);
                                                  in_obj.data._4_4_ =
                                                       Am_Value::operator_cast_to_int(pAVar5);
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                           "Checking point (");
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,iVar4);
                                                  poVar7 = std::operator<<(poVar7,",");
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<
                                                                     (poVar7,in_obj.data._4_4_);
                                                  poVar7 = std::operator<<(poVar7,")\n");
                                                  std::ostream::operator<<
                                                            (poVar7,std::
                                                  flush<char,std::char_traits<char>>);
                                                  Am_Point_In_Leaf((Am_Object *)&x1_1,0x10d2d8,iVar4
                                                                   ,(Am_Object *)
                                                                    (ulong)in_obj.data._4_4_,true,
                                                                   true);
                                                  pAVar8 = Am_Object::operator_cast_to_Am_Wrapper_
                                                                     ((Am_Object *)&x1_1);
                                                  if (pAVar8 == (Am_Wrapper *)0x0) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                             " NOT in an object\n");
                                                    std::ostream::operator<<
                                                              (poVar7,std::
                                                  flush<char,std::char_traits<char>>);
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                             "   in object ");
                                                    pvVar9 = (void *)operator<<(poVar7,(Am_Object *)
                                                                                       &x1_1);
                                                    pvVar9 = (void *)std::ostream::operator<<
                                                                               (pvVar9,std::
                                                  endl<char,std::char_traits<char>>);
                                                  std::ostream::operator<<
                                                            (pvVar9,std::
                                                  flush<char,std::char_traits<char>>);
                                                  }
                                                  Am_Object::~Am_Object((Am_Object *)&x1_1);
                                                  }
                                                  else {
                                                    Am_Input_Char::Am_Input_Char
                                                              ((Am_Input_Char *)&y1,"Y",true);
                                                    bVar1 = Am_Input_Char::operator==
                                                                      (&local_1c,(Am_Input_Char)y1);
                                                    if (bVar1) {
                                                      pAVar5 = (Am_Value *)
                                                               Am_Object::Get(0xd310,0x8b);
                                                      local_148 = Am_Value::operator_cast_to_int
                                                                            (pAVar5);
                                                      pAVar5 = (Am_Value *)
                                                               Am_Object::Get(0xd310,0x8c);
                                                      left = Am_Value::operator_cast_to_int(pAVar5);
                                                      Am_Object::Set(0xd310,0x8b,
                                                                     (ulong)(local_148 + 5));
                                                      Am_Object::Set(0xd310,0x8c,(ulong)(left + 5));
                                                    }
                                                    else {
                                                      Am_Input_Char::Am_Input_Char
                                                                (&local_150,"M",true);
                                                      bVar1 = Am_Input_Char::operator==
                                                                        (&local_1c,local_150);
                                                      if (bVar1) {
                                                        pAVar5 = (Am_Value *)
                                                                 Am_Object::Get(0xd310,100);
                                                        width = Am_Value::operator_cast_to_int
                                                                          (pAVar5);
                                                        Am_Object::Set(0xd310,100,(ulong)(width + 5)
                                                                      );
                                                      }
                                                      else {
                                                        Am_Input_Char::Am_Input_Char
                                                                  (&local_158,"W",true);
                                                        bVar1 = Am_Input_Char::operator==
                                                                          (&local_1c,local_158);
                                                        if (bVar1) {
                                                          pAVar5 = (Am_Value *)
                                                                   Am_Object::Get(0xd310,0x66);
                                                          local_15c = Am_Value::operator_cast_to_int
                                                                                (pAVar5);
                                                          Am_Object::Set(0xd310,0x66,
                                                                         (ulong)(local_15c + 5));
                                                        }
                                                        else {
                                                          Am_Input_Char::Am_Input_Char
                                                                    (&local_160,"R",true);
                                                          bVar1 = Am_Input_Char::operator==
                                                                            (&local_1c,local_160);
                                                          if (bVar1) {
                                                            uVar3 = Am_Object::Set(0xd310,0x8b,0x46)
                                                            ;
                                                            uVar3 = Am_Object::Set(uVar3,0x8c,0xf);
                                                            uVar3 = Am_Object::Set(uVar3,0x8d,0x91);
                                                            Am_Object::Set(uVar3,0x8e,0x91);
                                                          }
                                                          else {
                                                            Am_Input_Char::Am_Input_Char
                                                                      ((Am_Input_Char *)
                                                                       ((long)&o2.data + 4),"C",true
                                                                      );
                                                            bVar1 = Am_Input_Char::operator==
                                                                              (&local_1c,
                                                                               o2.data._4_4_);
                                                            if (bVar1) {
                                                              std::operator<<((ostream *)&std::cout,
                                                                                                                                                            
                                                  "** Adding object to a non-group obj. **THIS SHOULD CRASH**\n\n"
                                                  );
                                                  Am_Object::Create((char *)&local_170);
                                                  Am_Object::Am_Object(&local_178,&local_170);
                                                  Am_Object::Add_Part((Am_Object)0x10d310,
                                                                      SUB81(&local_178,0),1);
                                                  Am_Object::~Am_Object(&local_178);
                                                  Am_Object::~Am_Object(&local_170);
                                                  }
                                                  else {
                                                    print_help();
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, change_setting, (Am_Object self))
{
  Am_Object inter = self.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  if (c == "q") {
    if (screen2)
      screen2.Destroy();
    Am_Exit_Main_Event_Loop();
  } else if (c == "?") {
    print_help();
  } else if (c == "0") {
    static bool mode0 = false;
    if (mode0) {
      mode0 = false;
      g1.Set(Am_LEFT, 90).Set(Am_TOP, 90);
      window.Add_Part(g1);
      g1.Set(Am_LEFT, 140).Set(Am_TOP, 150);
    } else {
      mode0 = true;
      g1.Set(Am_LEFT, 100).Set(Am_TOP, 100);
      g1.Remove_From_Owner();
      g1.Set(Am_LEFT, 90).Set(Am_TOP, 90);
    }
  } else if (c == "1") {
    static bool mode1 = false;
    if (mode1) {
      mode1 = false;
      window.Set(Am_TITLE, "Test Opal");
    } else {
      mode1 = true;
      window.Set(Am_TITLE, "Hello World!");
    }
  } else if (c == "2") {
    static bool mode2 = false;
    if (mode2) {
      mode2 = false;
      g1.Add_Part(eek = Am_Rectangle.Create("eek")
                            .Set(Am_FILL_STYLE, Am_Blue)
                            .Set(Am_LEFT, 5)
                            .Set(Am_TOP, 5)
                            .Set(Am_WIDTH, 50)
                            .Set(Am_HEIGHT, 30));
    } else {
      mode2 = true;
      eek.Destroy();
    }
  } else if (c == "3") {
    static bool mode3 = false;
    if (mode3) {
      mode3 = false;
      r2.Set(Am_VISIBLE, true);
      r2.Set(Am_LEFT, 20).Set(Am_TOP, 20);
    } else {
      mode3 = true;
      r2.Set(Am_LEFT, 100).Set(Am_TOP, 100);
      r2.Set(Am_VISIBLE, false);
    }
  } else if (c == "4") {
    static bool mode4 = false;
    if (mode4) {
      mode4 = false;
      window.Add_Part(g1);
    } else {
      mode4 = true;
      g1.Remove_From_Owner();
    }
  } else if (c == "5") {
    if (!eek.Valid()) {
      cout << "** Can't do test 5 now because rectangle is gone; "
              "Use 2 to bring it back\n"
           << flush;
    } else {
      static bool mode5 = false;
      if (mode5) {
        mode5 = false;
        eek.Set(Am_LEFT, 5).Set(Am_TOP, 5);
      } else {
        mode5 = true;
        eek.Set(Am_LEFT, 10).Set(Am_TOP, 10);
      }
    }
  } else if (c == "6") {
    static bool mode6 = false;
    if (mode6) {
      mode6 = false;
      sw.Set(Am_TOP, 150);
    } else {
      mode6 = true;
      sw.Set(Am_TOP, 130);
    }
  } else if (c == "7") {
    static bool mode7 = false;
    if (mode7) {
      mode7 = false;
      sw.Set(Am_VISIBLE, true);
    } else {
      mode7 = true;
      sw.Set(Am_VISIBLE, false);
    }
  } else if (c == "8") {
    static bool mode8 = false;
    if (mode8) {
      mode8 = false;
      sw.Set(Am_WIDTH, 80);
    } else {
      mode8 = true;
      sw.Set(Am_WIDTH, 100);
    }
  } else if (c == "9") {
    static bool mode9 = false;
    if (mode9) {
      mode9 = false;
      window.Set(Am_WIDTH, 200);
    } else {
      mode9 = true;
      window.Set(Am_WIDTH, 250);
    }
  } else if (c == "a") {
    static bool modea = false;
    if (modea) {
      modea = false;
      r4.Set(Am_FILL_STYLE, Am_White);
    } else {
      modea = true;
      r4.Set(Am_FILL_STYLE, Am_Yellow);
    }
  } else if (c == "b") {
    static bool modeb = false;
    if (modeb) {
      modeb = false;
      second.Destroy();
    } else {
      modeb = true;
      second = window.Create("new window").Set(Am_LEFT, 375);
      int depth = second.Get_Object(PART1).Get(Am_OWNER_DEPTH);
      cout << "Depth of r1 = " << depth << " [-1]" << endl;
      Am_Screen.Add_Part(second);
    }
  } else if (c == "c") {
    static bool modec = false;
    if (modec) {
      modec = false;
      Am_Screen.Add_Part(window);
    } else {
      modec = true;
      window.Remove_From_Owner();
    }
  } else if (c == "d") {
    static bool moded = false;
    if (moded) {
      moded = false;
      third.Destroy();
    } else {
      moded = true;
      third = window.Copy().Set(Am_TOP, 455);
      Am_Screen.Add_Part(third);
    }
  } else if (c == "e") {
    static bool modee = false;
    if (modee) {
      modee = false;
      Am_To_Bottom(g1.Get_Object(OOK));
    } else {
      modee = true;
      Am_To_Top(g1.Get_Object(OOK));
    }
  } else if (c == "f") {
    static bool modef = false;
    if (modef) {
      modef = false;
      Am_To_Bottom(r1);
    } else {
      modef = true;
      Am_Move_Object(r1, r2, true);
    }
  } else if (c == "g") {
    static bool mode = false;
    mode = !mode;
    window.Set(Am_ICON_TITLE, mode ? "Hello World" : "Foo and Bar");
  } else if (c == "h") {
    static bool mode = false;
    mode = !mode;
    window.Set(Am_OMIT_TITLE_BAR, mode);
  } else if (c == "i") {
    static bool mode = false;
    mode = !mode;
    window.Set(Am_ICONIFIED, mode);
  } else if (c == "j") {
    static bool mode = false;
    window.Set(Am_FILL_STYLE, mode ? Am_Orange : Am_Blue);
    mode = !mode;
  } else if (c == "k") {
    static int mode = 0;
    switch (mode) {
    case 0:
      cout << "use min = false" << endl;
      window.Set(Am_MIN_WIDTH, 50);
      break;
    case 1:
      cout << "min width = 50" << endl;
      window.Set(Am_USE_MIN_WIDTH, true);
      break;
    case 2:
      cout << "min width = 70" << endl;
      window.Set(Am_MIN_WIDTH, 70);
      break;
    case 3:
      cout << "min width = false" << endl;
      window.Set(Am_USE_MIN_WIDTH, false);
      break;
    }
    mode = (mode + 1) % 4;
  } else if (c == "l") {
    static int mode = 0;
    switch (mode) {
    case 0:
      cout << "max width = false max height = 250" << endl;
      window.Set(Am_MAX_WIDTH, 200);
      window.Set(Am_MAX_HEIGHT, 250);
      window.Set(Am_USE_MAX_HEIGHT, true);
      break;
    case 1:
      cout << "max width = 200 max height = 250" << endl;
      window.Set(Am_USE_MAX_WIDTH, true);
      break;
    case 2:
      cout << "max width = 150 max height = false" << endl;
      window.Set(Am_MAX_WIDTH, 150);
      window.Set(Am_USE_MAX_HEIGHT, false);
      break;
    case 3:
      cout << "max width = false max height = false" << endl;
      window.Set(Am_USE_MAX_WIDTH, false);
      break;
    }
    mode = (mode + 1) % 4;
  } else if (c == "X") {
    int x1 = l1.Get(Am_X1);
    l1.Set(Am_X1, x1 + 5);
  } else if (c == "p") {
    int x = inter.Get(Am_FIRST_X);
    int y = inter.Get(Am_FIRST_Y);
    cout << "Checking point (" << x << "," << y << ")\n" << flush;
    Am_Object in_obj = Am_Point_In_Leaf(window, x, y, window);
    if (in_obj)
      cout << "   in object " << in_obj << endl << flush;
    else
      cout << " NOT in an object\n" << flush;
  } else if (c == "Y") {
    int x1 = l1.Get(Am_X1);
    int y1 = l1.Get(Am_Y1);
    l1.Set(Am_X1, x1 + 5);
    l1.Set(Am_Y1, y1 + 5);
  } else if (c == "M") {
    int left = l1.Get(Am_LEFT);
    // int top = l1.Get(Am_TOP);
    l1.Set(Am_LEFT, left + 5);
    // l1.Set(Am_TOP, top+5);
  } else if (c == "W") {
    int width = l1.Get(Am_WIDTH);
    //int height = l1.Get(Am_HEIGHT);
    l1.Set(Am_WIDTH, width + 5);
    //l1.Set(Am_HEIGHT, height+5);
  } else if (c == "R") {
    l1.Set(Am_X1, 70).Set(Am_Y1, 15).Set(Am_X2, 145).Set(Am_Y2, 145);
  } else if (c == "C") {
    cout << "** Adding object to a non-group obj. **THIS SHOULD CRASH**\n\n";
    Am_Object o2 = Am_Rectangle.Create();
    l1.Add_Part(o2);
  } else
    print_help();
}